

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

wchar_t attr_counter_set_collect(mtree_writer *mtree,mtree_entry_conflict *me)

{
  wchar_t wVar1;
  wchar_t wVar2;
  attr_counter_set *top;
  attr_counter *paVar3;
  wchar_t keys;
  attr_counter_set *acs;
  attr_counter *last;
  attr_counter *ac;
  mtree_entry_conflict *me_local;
  mtree_writer *mtree_local;
  
  top = &mtree->acs;
  wVar2 = mtree->keys;
  if ((wVar2 & 0x300000U) != 0) {
    if (top->uid_list == (attr_counter *)0x0) {
      paVar3 = attr_counter_new(me,(attr_counter *)0x0);
      top->uid_list = paVar3;
      if (top->uid_list == (attr_counter *)0x0) {
        return L'\xffffffff';
      }
    }
    else {
      acs = (attr_counter_set *)0x0;
      last = top->uid_list;
      while ((last != (attr_counter *)0x0 && (last->m_entry->uid != me->uid))) {
        acs = (attr_counter_set *)last;
        last = last->next;
      }
      wVar1 = attr_counter_inc(&top->uid_list,last,(attr_counter *)acs,me);
      if (wVar1 < L'\0') {
        return L'\xffffffff';
      }
    }
  }
  if ((wVar2 & 0x30U) != 0) {
    if ((mtree->acs).gid_list == (attr_counter *)0x0) {
      paVar3 = attr_counter_new(me,(attr_counter *)0x0);
      (mtree->acs).gid_list = paVar3;
      if ((mtree->acs).gid_list == (attr_counter *)0x0) {
        return L'\xffffffff';
      }
    }
    else {
      acs = (attr_counter_set *)0x0;
      last = (mtree->acs).gid_list;
      while ((last != (attr_counter *)0x0 && (last->m_entry->gid != me->gid))) {
        acs = (attr_counter_set *)last;
        last = last->next;
      }
      wVar1 = attr_counter_inc(&(mtree->acs).gid_list,last,(attr_counter *)acs,me);
      if (wVar1 < L'\0') {
        return L'\xffffffff';
      }
    }
  }
  if ((wVar2 & 0x200U) != 0) {
    if ((mtree->acs).mode_list == (attr_counter *)0x0) {
      paVar3 = attr_counter_new(me,(attr_counter *)0x0);
      (mtree->acs).mode_list = paVar3;
      if ((mtree->acs).mode_list == (attr_counter *)0x0) {
        return L'\xffffffff';
      }
    }
    else {
      acs = (attr_counter_set *)0x0;
      last = (mtree->acs).mode_list;
      while ((last != (attr_counter *)0x0 && (last->m_entry->mode != me->mode))) {
        acs = (attr_counter_set *)last;
        last = last->next;
      }
      wVar1 = attr_counter_inc(&(mtree->acs).mode_list,last,(attr_counter *)acs,me);
      if (wVar1 < L'\0') {
        return L'\xffffffff';
      }
    }
  }
  if ((wVar2 & 8U) != 0) {
    if ((mtree->acs).flags_list == (attr_counter *)0x0) {
      paVar3 = attr_counter_new(me,(attr_counter *)0x0);
      (mtree->acs).flags_list = paVar3;
      if ((mtree->acs).flags_list == (attr_counter *)0x0) {
        return L'\xffffffff';
      }
    }
    else {
      acs = (attr_counter_set *)0x0;
      last = (mtree->acs).flags_list;
      while ((last != (attr_counter *)0x0 &&
             ((last->m_entry->fflags_set != me->fflags_set ||
              (last->m_entry->fflags_clear != me->fflags_clear))))) {
        acs = (attr_counter_set *)last;
        last = last->next;
      }
      wVar2 = attr_counter_inc(&(mtree->acs).flags_list,last,(attr_counter *)acs,me);
      if (wVar2 < L'\0') {
        return L'\xffffffff';
      }
    }
  }
  return L'\0';
}

Assistant:

static int
attr_counter_set_collect(struct mtree_writer *mtree, struct mtree_entry *me)
{
	struct attr_counter *ac, *last;
	struct attr_counter_set *acs = &mtree->acs;
	int keys = mtree->keys;

	if (keys & (F_UNAME | F_UID)) {
		if (acs->uid_list == NULL) {
			acs->uid_list = attr_counter_new(me, NULL);
			if (acs->uid_list == NULL)
				return (-1);
		} else {
			last = NULL;
			for (ac = acs->uid_list; ac; ac = ac->next) {
				if (ac->m_entry->uid == me->uid)
					break;
				last = ac;
			}
			if (attr_counter_inc(&acs->uid_list, ac, last, me) < 0)
				return (-1);
		}
	}
	if (keys & (F_GNAME | F_GID)) {
		if (acs->gid_list == NULL) {
			acs->gid_list = attr_counter_new(me, NULL);
			if (acs->gid_list == NULL)
				return (-1);
		} else {
			last = NULL;
			for (ac = acs->gid_list; ac; ac = ac->next) {
				if (ac->m_entry->gid == me->gid)
					break;
				last = ac;
			}
			if (attr_counter_inc(&acs->gid_list, ac, last, me) < 0)
				return (-1);
		}
	}
	if (keys & F_MODE) {
		if (acs->mode_list == NULL) {
			acs->mode_list = attr_counter_new(me, NULL);
			if (acs->mode_list == NULL)
				return (-1);
		} else {
			last = NULL;
			for (ac = acs->mode_list; ac; ac = ac->next) {
				if (ac->m_entry->mode == me->mode)
					break;
				last = ac;
			}
			if (attr_counter_inc(&acs->mode_list, ac, last, me) < 0)
				return (-1);
		}
	}
	if (keys & F_FLAGS) {
		if (acs->flags_list == NULL) {
			acs->flags_list = attr_counter_new(me, NULL);
			if (acs->flags_list == NULL)
				return (-1);
		} else {
			last = NULL;
			for (ac = acs->flags_list; ac; ac = ac->next) {
				if (ac->m_entry->fflags_set == me->fflags_set &&
				    ac->m_entry->fflags_clear ==
							me->fflags_clear)
					break;
				last = ac;
			}
			if (attr_counter_inc(&acs->flags_list, ac, last, me) < 0)
				return (-1);
		}
	}

	return (0);
}